

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

Value * __thiscall
ot::commissioner::Interpreter::ProcessJoiner
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  ErrorCode EVar1;
  pointer pbVar2;
  undefined8 uVar3;
  int iVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  char *pcVar6;
  Value *pVVar7;
  char *pcVar8;
  _Alloc_hider _Var9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar10;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  string_view fmt;
  JoinerType type;
  string pskd;
  string pskd_1;
  CommissionerAppPtr commissioner;
  string provisioningUrl;
  uint64_t eui64;
  JoinerType local_40c;
  string local_408;
  undefined1 local_3e0 [8];
  _Alloc_hider local_3d8;
  char local_3d0 [8];
  char local_3c8 [16];
  _Alloc_hider local_3b8;
  size_type local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  format_string_checker<char> local_398;
  string *local_368;
  string *local_360;
  CommissionerAppPtr local_358;
  string local_340;
  unsigned_long local_320;
  string local_318;
  undefined4 local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f0;
  long local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  undefined4 local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c8;
  long local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  undefined4 local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2a0;
  long local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  undefined4 local_280;
  undefined1 *local_278;
  long local_270;
  undefined1 local_268 [16];
  undefined4 local_258;
  undefined1 *local_250;
  long local_248;
  undefined1 local_240 [16];
  undefined4 local_230;
  undefined1 *local_228;
  long local_220;
  undefined1 local_218 [16];
  undefined4 local_208 [2];
  long local_200;
  long local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  Error local_1e0;
  undefined4 local_1b8 [2];
  undefined1 *local_1b0;
  long local_1a8;
  undefined1 local_1a0 [16];
  undefined4 local_190 [2];
  long local_188;
  long local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  undefined4 local_168 [2];
  long local_160;
  long local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  Error local_140;
  undefined4 local_118 [2];
  long local_110;
  long local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  undefined4 local_f0 [2];
  long local_e8;
  long local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  Error local_c8;
  Error local_a0;
  Error local_78;
  string local_50;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  local_368 = (string *)&(__return_storage_ptr__->mError).mMessage;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  local_360 = (string *)&__return_storage_ptr__->mData;
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  local_358.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_358.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pbVar2 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x41) {
    local_398._0_8_ = local_398._0_8_ & 0xffffffff00000000;
    local_398.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "too few arguments";
    local_398.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x11;
    local_398.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_398.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_398.parse_funcs_[0] = (parse_func)0x0;
    pcVar8 = "too few arguments";
    local_398.context_.types_ = local_398.types_;
    do {
      pcVar6 = pcVar8 + 1;
      if (*pcVar8 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar8 + 2;
      }
      else if (*pcVar8 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar8,"",&local_398);
      }
      pcVar8 = pcVar6;
    } while (pcVar6 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_398;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_408,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    local_230 = 2;
    local_228 = local_218;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_228,local_408._M_dataplus._M_p,
               local_408._M_dataplus._M_p + local_408._M_string_length);
    local_3e0._0_4_ = local_230;
    local_3d8._M_p = local_3c8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_3d8,local_228,local_228 + local_220);
    local_3b0 = 0;
    local_3a8._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_3e0._0_4_;
    local_3b8._M_p = (pointer)&local_3a8;
    std::__cxx11::string::operator=(local_368,(string *)&local_3d8);
    std::__cxx11::string::operator=(local_360,(string *)&local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_p != &local_3a8) {
      operator_delete(local_3b8._M_p);
    }
    if (local_3d8._M_p != local_3c8) {
      operator_delete(local_3d8._M_p);
    }
    if (local_228 != local_218) {
      operator_delete(local_228);
    }
    paVar5 = &local_408.field_2;
    goto LAB_0023d846;
  }
  GetJoinerType(&local_78,&local_40c,pbVar2 + 2);
  local_3e0._0_4_ = local_78.mCode;
  local_3d8._M_p = local_3c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3d8,local_78.mMessage._M_dataplus._M_p,
             local_78.mMessage._M_dataplus._M_p + local_78.mMessage._M_string_length);
  local_3b0 = 0;
  local_3a8._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mError).mCode = local_3e0._0_4_;
  local_3b8._M_p = (pointer)&local_3a8;
  std::__cxx11::string::operator=(local_368,(string *)&local_3d8);
  std::__cxx11::string::operator=(local_360,(string *)&local_3b8);
  EVar1 = (__return_storage_ptr__->mError).mCode;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_p != &local_3a8) {
    operator_delete(local_3b8._M_p);
  }
  if (local_3d8._M_p != local_3c8) {
    operator_delete(local_3d8._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.mMessage._M_dataplus._M_p != &local_78.mMessage.field_2) {
    operator_delete(local_78.mMessage._M_dataplus._M_p);
  }
  if (EVar1 != kNone) goto LAB_0023d854;
  JobManager::GetSelectedCommissioner
            (&local_a0,
             (this->mJobManager).
             super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_358);
  local_3e0._0_4_ = local_a0.mCode;
  local_3d8._M_p = local_3c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3d8,local_a0.mMessage._M_dataplus._M_p,
             local_a0.mMessage._M_dataplus._M_p + local_a0.mMessage._M_string_length);
  local_3b0 = 0;
  local_3a8._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mError).mCode = local_3e0._0_4_;
  local_3b8._M_p = (pointer)&local_3a8;
  std::__cxx11::string::operator=(local_368,(string *)&local_3d8);
  std::__cxx11::string::operator=(local_360,(string *)&local_3b8);
  EVar1 = (__return_storage_ptr__->mError).mCode;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_p != &local_3a8) {
    operator_delete(local_3b8._M_p);
  }
  if (local_3d8._M_p != local_3c8) {
    operator_delete(local_3d8._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.mMessage._M_dataplus._M_p != &local_a0.mMessage.field_2) {
    operator_delete(local_a0.mMessage._M_dataplus._M_p);
  }
  if (EVar1 != kNone) goto LAB_0023d854;
  pbVar2 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"enable","");
  utils::ToLower((string *)local_3e0,pbVar2 + 1);
  utils::ToLower((string *)&local_398,&local_408);
  uVar3 = local_398._0_8_;
  if (local_3d8._M_p == local_398.context_.super_basic_format_parse_context<char>.format_str_.data_)
  {
    if (local_3d8._M_p == (char *)0x0) {
      bVar10 = true;
    }
    else {
      iVar4 = bcmp((void *)local_3e0,(void *)local_398._0_8_,(size_t)local_3d8._M_p);
      bVar10 = iVar4 == 0;
    }
  }
  else {
    bVar10 = false;
  }
  if ((size_t *)uVar3 !=
      &local_398.context_.super_basic_format_parse_context<char>.format_str_.size_) {
    operator_delete((void *)uVar3);
  }
  if (local_3e0 != (undefined1  [8])local_3d0) {
    operator_delete((void *)local_3e0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p);
  }
  if (bVar10) {
    local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
    local_408._M_string_length = 0;
    local_408.field_2._M_local_buf[0] = '\0';
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    local_340._M_string_length = 0;
    local_340.field_2._M_local_buf[0] = '\0';
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(aExpr->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <
        (ulong)(local_40c == kMeshCoP) + 4) {
      local_398._0_8_ = local_398._0_8_ & 0xffffffff00000000;
      local_398.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "too few arguments";
      local_398.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x11;
      local_398.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_398.context_.super_basic_format_parse_context<char>._20_4_ = 0;
      local_398.parse_funcs_[0] = (parse_func)0x0;
      pcVar8 = "too few arguments";
      local_398.context_.types_ = local_398.types_;
      do {
        pcVar6 = pcVar8 + 1;
        if (*pcVar8 == '}') {
          if ((pcVar6 == "") || (*pcVar6 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar6 = pcVar8 + 2;
        }
        else if (*pcVar8 == '{') {
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar8,"",&local_398);
        }
        pcVar8 = pcVar6;
      } while (pcVar6 != "");
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&local_398;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_318,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_00);
      local_258 = 2;
      local_250 = local_240;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,local_318._M_dataplus._M_p,
                 local_318._M_dataplus._M_p + local_318._M_string_length);
      local_3e0._0_4_ = local_258;
      local_3d8._M_p = local_3c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3d8,local_250,local_250 + local_248);
      local_3b0 = 0;
      local_3a8._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_3e0._0_4_;
      local_3b8._M_p = (pointer)&local_3a8;
      std::__cxx11::string::operator=(local_368,(string *)&local_3d8);
      std::__cxx11::string::operator=(local_360,(string *)&local_3b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_p != &local_3a8) {
        operator_delete(local_3b8._M_p);
      }
      if (local_3d8._M_p != local_3c8) {
        operator_delete(local_3d8._M_p);
      }
      if (local_250 != local_240) {
        operator_delete(local_250);
      }
      paVar5 = &local_318.field_2;
LAB_0023dcc4:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*(undefined1 **)(paVar5->_M_local_buf + -0x10) != paVar5) {
        operator_delete(*(undefined1 **)(paVar5->_M_local_buf + -0x10));
      }
    }
    else {
      utils::ParseInteger<unsigned_long>(&local_c8,&local_320,pbVar2 + 3);
      local_3e0._0_4_ = local_c8.mCode;
      local_3d8._M_p = local_3c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3d8,local_c8.mMessage._M_dataplus._M_p,
                 local_c8.mMessage._M_dataplus._M_p + local_c8.mMessage._M_string_length);
      local_3b0 = 0;
      local_3a8._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_3e0._0_4_;
      local_3b8._M_p = (pointer)&local_3a8;
      std::__cxx11::string::operator=(local_368,(string *)&local_3d8);
      std::__cxx11::string::operator=(local_360,(string *)&local_3b8);
      EVar1 = (__return_storage_ptr__->mError).mCode;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_p != &local_3a8) {
        operator_delete(local_3b8._M_p);
      }
      if (local_3d8._M_p != local_3c8) {
        operator_delete(local_3d8._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.mMessage._M_dataplus._M_p != &local_c8.mMessage.field_2) {
        operator_delete(local_c8.mMessage._M_dataplus._M_p);
      }
      if (EVar1 == kNone) {
        if ((local_40c == kMeshCoP) &&
           (std::__cxx11::string::_M_assign((string *)&local_408),
           0xa0 < (ulong)((long)(aExpr->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(aExpr->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start))) {
          std::__cxx11::string::_M_assign((string *)&local_340);
        }
        (*((local_358.
            super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           )->super_CommissionerHandler)._vptr_CommissionerHandler[0x15])
                  (local_f0,local_358.
                            super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,(ulong)local_40c,local_320,&local_408,&local_340);
        local_3e0._0_4_ = local_f0[0];
        local_3d8._M_p = local_3c8;
        std::__cxx11::string::_M_construct<char*>((string *)&local_3d8,local_e8,local_e0 + local_e8)
        ;
        local_3b0 = 0;
        local_3a8._M_local_buf[0] = '\0';
        local_3b8._M_p = (pointer)&local_3a8;
        Value::operator=(__return_storage_ptr__,(Value *)local_3e0);
        Value::~Value((Value *)local_3e0);
        paVar5 = &local_d8;
        goto LAB_0023dcc4;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p);
    }
    paVar5 = &local_408.field_2;
    _Var9._M_p = local_408._M_dataplus._M_p;
  }
  else {
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"enableall","");
    utils::ToLower((string *)local_3e0,pbVar2 + 1);
    utils::ToLower((string *)&local_398,&local_408);
    uVar3 = local_398._0_8_;
    if (local_3d8._M_p ==
        local_398.context_.super_basic_format_parse_context<char>.format_str_.data_) {
      if (local_3d8._M_p == (char *)0x0) {
        bVar10 = true;
      }
      else {
        iVar4 = bcmp((void *)local_3e0,(void *)local_398._0_8_,(size_t)local_3d8._M_p);
        bVar10 = iVar4 == 0;
      }
    }
    else {
      bVar10 = false;
    }
    if ((size_t *)uVar3 !=
        &local_398.context_.super_basic_format_parse_context<char>.format_str_.size_) {
      operator_delete((void *)uVar3);
    }
    if (local_3e0 != (undefined1  [8])local_3d0) {
      operator_delete((void *)local_3e0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p);
    }
    if (bVar10) {
      local_398._0_8_ = &local_398.context_.super_basic_format_parse_context<char>.format_str_.size_
      ;
      local_398.context_.super_basic_format_parse_context<char>.format_str_.data_ = (char *)0x0;
      local_398.context_.super_basic_format_parse_context<char>.format_str_.size_ =
           local_398.context_.super_basic_format_parse_context<char>.format_str_.size_ &
           0xffffffffffffff00;
      local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
      local_408._M_string_length = 0;
      local_408.field_2._M_local_buf[0] = '\0';
      if (local_40c == kMeshCoP) {
        if (0x60 < (ulong)((long)(aExpr->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(aExpr->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)) {
          std::__cxx11::string::_M_assign((string *)&local_398);
          if (0x80 < (ulong)((long)(aExpr->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(aExpr->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)) {
            std::__cxx11::string::_M_assign((string *)&local_408);
          }
          goto LAB_0023dd90;
        }
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        args_01.field_1.args_ = in_R9.args_;
        args_01.desc_ = (unsigned_long_long)&local_318;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_340,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_01);
        local_280 = 2;
        local_278 = local_268;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_278,local_340._M_dataplus._M_p,
                   local_340._M_dataplus._M_p + local_340._M_string_length);
        local_3e0._0_4_ = local_280;
        local_3d8._M_p = local_3c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3d8,local_278,local_278 + local_270);
        local_3b0 = 0;
        local_3a8._M_local_buf[0] = '\0';
        local_3b8._M_p = (pointer)&local_3a8;
        Value::operator=(__return_storage_ptr__,(Value *)local_3e0);
        Value::~Value((Value *)local_3e0);
        if (local_278 != local_268) {
          operator_delete(local_278);
        }
        paVar5 = &local_340.field_2;
      }
      else {
LAB_0023dd90:
        (*((local_358.
            super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           )->super_CommissionerHandler)._vptr_CommissionerHandler[0x17])
                  (local_118,
                   local_358.
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,(ulong)local_40c,&local_398,&local_408);
        local_3e0._0_4_ = local_118[0];
        local_3d8._M_p = local_3c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3d8,local_110,local_108 + local_110);
        local_3b0 = 0;
        local_3a8._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_3e0._0_4_;
        local_3b8._M_p = (pointer)&local_3a8;
        std::__cxx11::string::operator=(local_368,(string *)&local_3d8);
        std::__cxx11::string::operator=(local_360,(string *)&local_3b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_p != &local_3a8) {
          operator_delete(local_3b8._M_p);
        }
        if (local_3d8._M_p != local_3c8) {
          operator_delete(local_3d8._M_p);
        }
        paVar5 = &local_100;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*(undefined1 **)(paVar5->_M_local_buf + -0x10) != paVar5) {
        operator_delete(*(undefined1 **)(paVar5->_M_local_buf + -0x10));
      }
      _Var9._M_p = local_408._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p != &local_408.field_2) {
LAB_0023de6c:
        operator_delete(_Var9._M_p);
      }
LAB_0023de71:
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&local_398.context_.super_basic_format_parse_context<char>.format_str_.size_;
      _Var9._M_p = (pointer)local_398._0_8_;
    }
    else {
      pbVar2 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"disable","");
      utils::ToLower((string *)local_3e0,pbVar2 + 1);
      utils::ToLower((string *)&local_398,&local_408);
      uVar3 = local_398._0_8_;
      if (local_3d8._M_p ==
          local_398.context_.super_basic_format_parse_context<char>.format_str_.data_) {
        if (local_3d8._M_p == (char *)0x0) {
          bVar10 = true;
        }
        else {
          iVar4 = bcmp((void *)local_3e0,(void *)local_398._0_8_,(size_t)local_3d8._M_p);
          bVar10 = iVar4 == 0;
        }
      }
      else {
        bVar10 = false;
      }
      if ((size_t *)uVar3 !=
          &local_398.context_.super_basic_format_parse_context<char>.format_str_.size_) {
        operator_delete((void *)uVar3);
      }
      if (local_3e0 != (undefined1  [8])local_3d0) {
        operator_delete((void *)local_3e0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p != &local_408.field_2) {
        operator_delete(local_408._M_dataplus._M_p);
      }
      if (!bVar10) {
        pbVar2 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_3e0 = (undefined1  [8])local_3d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"disableall","");
        bVar10 = CaseInsensitiveEqual(pbVar2 + 1,(string *)local_3e0);
        if (local_3e0 != (undefined1  [8])local_3d0) {
          operator_delete((void *)local_3e0);
        }
        if (bVar10) {
          (*((local_358.
              super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_CommissionerHandler)._vptr_CommissionerHandler[0x18])
                    (local_190,
                     local_358.
                     super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,(ulong)local_40c);
          local_3e0._0_4_ = local_190[0];
          local_3d8._M_p = local_3c8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3d8,local_188,local_180 + local_188);
          local_3b0 = 0;
          local_3a8._M_local_buf[0] = '\0';
          local_3b8._M_p = (pointer)&local_3a8;
          Value::operator=(__return_storage_ptr__,(Value *)local_3e0);
          Value::~Value((Value *)local_3e0);
          paVar5 = &local_178;
          goto LAB_0023d846;
        }
        pbVar2 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_3e0 = (undefined1  [8])local_3d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"getport","");
        bVar10 = CaseInsensitiveEqual(pbVar2 + 1,(string *)local_3e0);
        if (local_3e0 != (undefined1  [8])local_3d0) {
          operator_delete((void *)local_3e0);
        }
        if (bVar10) {
          (*((local_358.
              super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_CommissionerHandler)._vptr_CommissionerHandler[0x19])
                    (local_1b8,
                     local_358.
                     super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,&local_398,(ulong)local_40c);
          local_3e0._0_4_ = local_1b8[0];
          local_3d8._M_p = local_3c8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3d8,local_1b0,local_1b0 + local_1a8);
          local_3b0 = 0;
          local_3a8._M_local_buf[0] = '\0';
          local_3b8._M_p = (pointer)&local_3a8;
          pVVar7 = Value::operator=(__return_storage_ptr__,(Value *)local_3e0);
          EVar1 = (pVVar7->mError).mCode;
          Value::~Value((Value *)local_3e0);
          if (local_1b0 != local_1a0) {
            operator_delete(local_1b0);
          }
          if (EVar1 != kNone) goto LAB_0023d854;
          std::__cxx11::to_string(&local_50,(uint)(ushort)(undefined2)local_398.types_[0]);
          Value::Value((Value *)local_3e0,&local_50);
          Value::operator=(__return_storage_ptr__,(Value *)local_3e0);
          Value::~Value((Value *)local_3e0);
          paVar5 = &local_50.field_2;
          goto LAB_0023d846;
        }
        pbVar2 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_3e0 = (undefined1  [8])local_3d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"setport","");
        bVar10 = CaseInsensitiveEqual(pbVar2 + 1,(string *)local_3e0);
        if (local_3e0 != (undefined1  [8])local_3d0) {
          operator_delete((void *)local_3e0);
        }
        if (bVar10) {
          pbVar2 = (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (0x60 < (ulong)((long)(aExpr->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2)) {
            utils::ParseInteger<unsigned_short>(&local_1e0,(unsigned_short *)&local_340,pbVar2 + 3);
            local_3e0._0_4_ = local_1e0.mCode;
            local_3d8._M_p = local_3c8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_3d8,local_1e0.mMessage._M_dataplus._M_p,
                       local_1e0.mMessage._M_dataplus._M_p + local_1e0.mMessage._M_string_length);
            local_3b0 = 0;
            local_3a8._M_local_buf[0] = '\0';
            local_3b8._M_p = (pointer)&local_3a8;
            pVVar7 = Value::operator=(__return_storage_ptr__,(Value *)local_3e0);
            EVar1 = (pVVar7->mError).mCode;
            Value::~Value((Value *)local_3e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0.mMessage._M_dataplus._M_p != &local_1e0.mMessage.field_2) {
              operator_delete(local_1e0.mMessage._M_dataplus._M_p);
            }
            if (EVar1 != kNone) goto LAB_0023d854;
            (*((local_358.
                super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_CommissionerHandler)._vptr_CommissionerHandler[0x1a])
                      (local_208,
                       local_358.
                       super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(ulong)local_40c,(ulong)local_340._M_dataplus._M_p & 0xffff);
            local_3e0._0_4_ = local_208[0];
            local_3d8._M_p = local_3c8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_3d8,local_200,local_1f8 + local_200);
            local_3b0 = 0;
            local_3a8._M_local_buf[0] = '\0';
            local_3b8._M_p = (pointer)&local_3a8;
            Value::operator=(__return_storage_ptr__,(Value *)local_3e0);
            Value::~Value((Value *)local_3e0);
            paVar5 = &local_1f0;
            goto LAB_0023d846;
          }
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          args_04.field_1.values_ = in_R9.values_;
          args_04.desc_ = (unsigned_long_long)&local_408;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)&local_398,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),
                     args_04);
          local_2d0 = 2;
          paVar5 = &local_2b8;
          local_2c8 = paVar5;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2c8,local_398._0_8_,
                     local_398.context_.super_basic_format_parse_context<char>.format_str_.data_ +
                     local_398._0_8_);
          local_3e0._0_4_ = local_2d0;
          local_3d8._M_p = local_3c8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3d8,local_2c8,local_2c8->_M_local_buf + local_2c0);
          local_3b0 = 0;
          local_3a8._M_local_buf[0] = '\0';
          local_3b8._M_p = (pointer)&local_3a8;
          Value::operator=(__return_storage_ptr__,(Value *)local_3e0);
          Value::~Value((Value *)local_3e0);
          _Var9._M_p = (pointer)local_2c8;
        }
        else {
          ::fmt::v10::detail::
          check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                    ();
          pbVar2 = (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_408._M_dataplus._M_p = pbVar2[1]._M_dataplus._M_p;
          local_408._M_string_length = pbVar2[1]._M_string_length;
          args_03.field_1.values_ = in_R9.values_;
          args_03.desc_ = (unsigned_long_long)&local_408;
          fmt.size_ = 0xd;
          fmt.data_ = (char *)0x1f;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)&local_398,(v10 *)"\'{}\' is not a valid sub-command",fmt,args_03);
          local_2f8 = 3;
          paVar5 = &local_2e0;
          local_2f0 = paVar5;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2f0,local_398._0_8_,
                     local_398.context_.super_basic_format_parse_context<char>.format_str_.data_ +
                     local_398._0_8_);
          local_3e0._0_4_ = local_2f8;
          local_3d8._M_p = local_3c8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3d8,local_2f0,local_2f0->_M_local_buf + local_2e8);
          local_3b0 = 0;
          local_3a8._M_local_buf[0] = '\0';
          local_3b8._M_p = (pointer)&local_3a8;
          Value::operator=(__return_storage_ptr__,(Value *)local_3e0);
          Value::~Value((Value *)local_3e0);
          _Var9._M_p = (pointer)local_2f0;
        }
LAB_0023e325:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var9._M_p != paVar5) goto LAB_0023de6c;
        goto LAB_0023de71;
      }
      pbVar2 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(aExpr->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x61) {
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        args_02.field_1.args_ = in_R9.args_;
        args_02.desc_ = (unsigned_long_long)&local_408;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)&local_398,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),
                   args_02);
        local_2a8 = 2;
        paVar5 = &local_290;
        local_2a0 = paVar5;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2a0,local_398._0_8_,
                   local_398.context_.super_basic_format_parse_context<char>.format_str_.data_ +
                   local_398._0_8_);
        local_3e0._0_4_ = local_2a8;
        local_3d8._M_p = local_3c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3d8,local_2a0,local_2a0->_M_local_buf + local_298);
        local_3b0 = 0;
        local_3a8._M_local_buf[0] = '\0';
        local_3b8._M_p = (pointer)&local_3a8;
        Value::operator=(__return_storage_ptr__,(Value *)local_3e0);
        Value::~Value((Value *)local_3e0);
        _Var9._M_p = (pointer)local_2a0;
        goto LAB_0023e325;
      }
      utils::ParseInteger<unsigned_long>(&local_140,(unsigned_long *)&local_340,pbVar2 + 3);
      local_3e0._0_4_ = local_140.mCode;
      local_3d8._M_p = local_3c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3d8,local_140.mMessage._M_dataplus._M_p,
                 local_140.mMessage._M_dataplus._M_p + local_140.mMessage._M_string_length);
      local_3b0 = 0;
      local_3a8._M_local_buf[0] = '\0';
      local_3b8._M_p = (pointer)&local_3a8;
      pVVar7 = Value::operator=(__return_storage_ptr__,(Value *)local_3e0);
      EVar1 = (pVVar7->mError).mCode;
      Value::~Value((Value *)local_3e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140.mMessage._M_dataplus._M_p != &local_140.mMessage.field_2) {
        operator_delete(local_140.mMessage._M_dataplus._M_p);
      }
      if (EVar1 != kNone) goto LAB_0023d854;
      (*((local_358.
          super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->super_CommissionerHandler)._vptr_CommissionerHandler[0x16])
                (local_168,
                 local_358.
                 super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(ulong)local_40c,local_340._M_dataplus._M_p);
      local_3e0._0_4_ = local_168[0];
      local_3d8._M_p = local_3c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3d8,local_160,local_158 + local_160);
      local_3b0 = 0;
      local_3a8._M_local_buf[0] = '\0';
      local_3b8._M_p = (pointer)&local_3a8;
      Value::operator=(__return_storage_ptr__,(Value *)local_3e0);
      Value::~Value((Value *)local_3e0);
      paVar5 = &local_150;
LAB_0023d846:
      _Var9._M_p = *(pointer *)(paVar5->_M_local_buf + -0x10);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var9._M_p != paVar5) {
    operator_delete(_Var9._M_p);
  }
LAB_0023d854:
  if (local_358.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_358.
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessJoiner(const Expression &aExpr)
{
    Value              value;
    JoinerType         type;
    CommissionerAppPtr commissioner = nullptr;

    VerifyOrExit(aExpr.size() >= 3, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    SuccessOrExit(value = GetJoinerType(type, aExpr[2]));
    SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));

    if (CaseInsensitiveEqual(aExpr[1], "enable"))
    {
        uint64_t    eui64;
        std::string pskd;
        std::string provisioningUrl;

        VerifyOrExit(aExpr.size() >= (type == JoinerType::kMeshCoP ? 5 : 4),
                     value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        SuccessOrExit(value = ParseInteger(eui64, aExpr[3]));
        if (type == JoinerType::kMeshCoP)
        {
            pskd = aExpr[4];
            if (aExpr.size() >= 6)
            {
                provisioningUrl = aExpr[5];
            }
        }

        SuccessOrExit(value = commissioner->EnableJoiner(type, eui64, pskd, provisioningUrl));
    }
    else if (CaseInsensitiveEqual(aExpr[1], "enableall"))
    {
        std::string pskd;
        std::string provisioningUrl;
        if (type == JoinerType::kMeshCoP)
        {
            VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            pskd = aExpr[3];
            if (aExpr.size() >= 5)
            {
                provisioningUrl = aExpr[4];
            }
        }

        SuccessOrExit(value = commissioner->EnableAllJoiners(type, pskd, provisioningUrl));
    }
    else if (CaseInsensitiveEqual(aExpr[1], "disable"))
    {
        uint64_t eui64;
        VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        SuccessOrExit(value = ParseInteger(eui64, aExpr[3]));
        SuccessOrExit(value = commissioner->DisableJoiner(type, eui64));
    }
    else if (CaseInsensitiveEqual(aExpr[1], "disableall"))
    {
        SuccessOrExit(value = commissioner->DisableAllJoiners(type));
    }
    else if (CaseInsensitiveEqual(aExpr[1], "getport"))
    {
        uint16_t port;
        SuccessOrExit(value = commissioner->GetJoinerUdpPort(port, type));
        value = std::to_string(port);
    }
    else if (CaseInsensitiveEqual(aExpr[1], "setport"))
    {
        uint16_t port;
        VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        SuccessOrExit(value = ParseInteger(port, aExpr[3]));
        SuccessOrExit(value = commissioner->SetJoinerUdpPort(type, port));
    }
    else
    {
        value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]);
    }

exit:
    return value;
}